

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O0

void __thiscall
cmsys::
hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
::_M_initialize_buckets
          (hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
           *this,size_type __n)

{
  value_type local_38;
  __normal_iterator<cmsys::_Hashtable_node<int>_**,_std::vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>_>
  local_30;
  const_iterator local_28;
  size_type local_20;
  size_type __n_buckets;
  size_type __n_local;
  hashtable<int,_int,_cmsys::hash<int>,_cmsys::_Identity<int>,_std::equal_to<int>,_std::allocator<char>_>
  *this_local;
  
  __n_buckets = __n;
  __n_local = (size_type)this;
  local_20 = _M_next_size(this,__n);
  std::vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::
  reserve(&this->_M_buckets,local_20);
  local_30._M_current =
       (_Hashtable_node<int> **)
       std::vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::
       end(&this->_M_buckets);
  __gnu_cxx::
  __normal_iterator<cmsys::_Hashtable_node<int>*const*,std::vector<cmsys::_Hashtable_node<int>*,std::allocator<cmsys::_Hashtable_node<int>*>>>
  ::__normal_iterator<cmsys::_Hashtable_node<int>**>
            ((__normal_iterator<cmsys::_Hashtable_node<int>*const*,std::vector<cmsys::_Hashtable_node<int>*,std::allocator<cmsys::_Hashtable_node<int>*>>>
              *)&local_28,&local_30);
  local_38 = (value_type)0x0;
  std::vector<cmsys::_Hashtable_node<int>_*,_std::allocator<cmsys::_Hashtable_node<int>_*>_>::insert
            (&this->_M_buckets,local_28,local_20,&local_38);
  this->_M_num_elements = 0;
  return;
}

Assistant:

void _M_initialize_buckets(size_type __n)
  {
    const size_type __n_buckets = _M_next_size(__n);
    _M_buckets.reserve(__n_buckets);
    _M_buckets.insert(_M_buckets.end(), __n_buckets, (_Node*) 0);
    _M_num_elements = 0;
  }